

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::SubroutineIndexNegativeLinkIndexReused::Run
          (SubroutineIndexNegativeLinkIndexReused *this)

{
  UniformValueGenerator *generator;
  long lVar1;
  Loc _location;
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  subroutineUniforms;
  SubroutineFunctionSet functions_st0;
  SubroutineUniform local_178;
  
  generator = &(this->super_ExplicitUniformLocationCaseBase).uniformValueGenerator;
  SubroutineFunctionSet::SubroutineFunctionSet(&functions_st0,generator,0);
  SubroutineFunction::SubroutineFunction
            ((SubroutineFunction *)&local_178,generator,(Index)ZEXT812(2));
  SubroutineFunctionSet::push_back(&functions_st0,(SubroutineFunction *)&local_178);
  SubroutineFunction::~SubroutineFunction((SubroutineFunction *)&local_178);
  SubroutineFunction::SubroutineFunction
            ((SubroutineFunction *)&local_178,generator,(Index)ZEXT812(2));
  SubroutineFunctionSet::push_back(&functions_st0,(SubroutineFunction *)&local_178);
  SubroutineFunction::~SubroutineFunction((SubroutineFunction *)&local_178);
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  subroutineUniforms.
  super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _location.super_LayoutSpecifierBase.occurence.occurence = NONE_SH;
  _location.super_LayoutSpecifierBase.val = 1999999;
  _location.super_LayoutSpecifierBase.numSys = Dec;
  SubroutineUniform::SubroutineUniform
            (&local_178,generator,&functions_st0,_location,0,(DefOccurence)0x2,true);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::push_back(&subroutineUniforms,&local_178);
  SubroutineUniform::~SubroutineUniform(&local_178);
  lVar1 = ExplicitUniformLocationCaseBase::doRunNegativeLink
                    (&this->super_ExplicitUniformLocationCaseBase,&subroutineUniforms);
  std::
  vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
  ::~vector(&subroutineUniforms);
  SubroutineFunctionSet::~SubroutineFunctionSet(&functions_st0);
  return lVar1;
}

Assistant:

virtual long Run()
	{
		//subroutine vec4 st0(float param);
		SubroutineFunctionSet functions_st0(uniformValueGenerator);
		//layout(index = 2) subroutine(st0) vec4 sf0(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(2)));
		//layout(index = 2) subroutine(st0) vec4 sf1(float param) { .... };
		functions_st0.push_back(SubroutineFunction(uniformValueGenerator, Index::C(2)));

		std::vector<SubroutineUniform> subroutineUniforms;

		//subroutine uniform st0 u0;
		subroutineUniforms.push_back(
			SubroutineUniform(uniformValueGenerator, functions_st0, Loc::Implicit(), 0, DefOccurence::FSH_OR_CSH));
		return doRunNegativeLink(subroutineUniforms);
	}